

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O3

PSFFile * PSFFile::load(string *filename)

{
  pointer *ppuVar1;
  iterator __position;
  _Base_ptr __n;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar6;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  PSFFile *this;
  uchar *puVar10;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar11;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar12;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar13;
  iterator __pos;
  uchar *puVar14;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar15;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar16;
  ulong uVar17;
  uchar *puVar18;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var19;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar20;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar21;
  uint8_t data [4];
  uint8_t sig [3];
  uint8_t tag_marker [5];
  string tag_var_name;
  string tag_var_value;
  stat st;
  uint local_138;
  short local_133;
  char local_131;
  uchar *local_130;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_128;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_120;
  int local_115;
  char local_111;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0 [144];
  
  iVar8 = stat((filename->_M_dataplus)._M_p,(stat *)local_c0);
  puVar14 = (uchar *)(-(ulong)(iVar8 != 0) | local_c0._48_8_);
  if ((long)puVar14 < 0) {
    return (PSFFile *)0x0;
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    sVar9 = fread(&local_133,1,3,__stream);
    if (((sVar9 == 3) && (local_131 == 'F' && local_133 == 0x5350)) &&
       (sVar9 = fread(&local_138,1,1,__stream), sVar9 == 1)) {
      uVar2 = (uint8_t)local_138;
      sVar9 = fread(&local_138,1,4,__stream);
      uVar3 = local_138;
      if (sVar9 == 4) {
        uVar17 = (ulong)local_138;
        sVar9 = fread(&local_138,1,4,__stream);
        uVar4 = local_138;
        if (sVar9 == 4) {
          p_Var19 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)(ulong)local_138;
          sVar9 = fread(&local_138,1,4,__stream);
          if ((sVar9 == 4) && (puVar10 = (uchar *)(ulong)(uVar3 + uVar4 + 0x10), puVar10 <= puVar14)
             ) {
            local_110 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                        CONCAT44(local_110._4_4_,local_138);
            local_130 = puVar10;
            local_120 = p_Var19;
            this = (PSFFile *)operator_new(0x110);
            PSFFile(this);
            this->version = uVar2;
            puVar10 = (uchar *)operator_new__(uVar17);
            sVar9 = fread(puVar10,1,uVar17,__stream);
            if (sVar9 == uVar17) {
              if (uVar3 != 0) {
                local_128 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&this->reserved;
                puVar18 = puVar10;
                do {
                  __position._M_current =
                       (this->reserved).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this->reserved).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_realloc_insert<unsigned_char_const&>(local_128,__position,puVar18);
                  }
                  else {
                    *__position._M_current = *puVar18;
                    ppuVar1 = &(this->reserved).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar1 = *ppuVar1 + 1;
                  }
                  puVar18 = puVar18 + 1;
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
              }
              operator_delete__(puVar10);
              p_Var19 = local_120;
              uVar17 = (ulong)local_120 & 0xffffffff;
              puVar10 = (uchar *)operator_new__(uVar17);
              sVar9 = fread(puVar10,1,uVar17,__stream);
              if (sVar9 == uVar17) {
                iVar8 = crc32(0,puVar10,(ulong)p_Var19 & 0xffffffff);
                if ((int)local_110 == iVar8) {
                  ZlibReader::assign(&this->compressed_exe,puVar10,uVar17);
                  operator_delete__(puVar10);
                  sVar9 = fread(&local_115,1,5,__stream);
                  if ((sVar9 != 5) || (local_111 != ']' || local_115 != 0x4741545b)) {
LAB_00105b75:
                    fclose(__stream);
                    return this;
                  }
                  puVar18 = (uchar *)(ulong)((int)local_130 + 5);
                  pvVar20 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                            (puVar14 + -(long)puVar18);
                  local_130 = (uchar *)operator_new__((ulong)(pvVar20 + 1));
                  pvVar11 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                            fread(local_130,1,(size_t)pvVar20,__stream);
                  puVar10 = local_130;
                  local_128 = pvVar20;
                  if (pvVar11 == pvVar20) {
                    local_130[(long)pvVar20] = '\0';
                    if (puVar14 != puVar18) {
                      local_110 = pvVar20 + (long)local_130;
                      local_120 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                   *)&this->tags;
                      local_c8 = &(this->tags)._M_t._M_impl.super__Rb_tree_header._M_header;
                      pvVar11 = (vector<unsigned_char,std::allocator<unsigned_char>> *)0x0;
                      do {
                        pvVar11 = pvVar11 + (long)puVar10;
                        pvVar20 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                                  strchr((char *)pvVar11,10);
                        if (pvVar20 == (vector<unsigned_char,std::allocator<unsigned_char>> *)0x0) {
                          pvVar20 = local_110;
                        }
                        *pvVar20 = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
                        pvVar12 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                                  strchr((char *)pvVar11,0x3d);
                        if (pvVar12 != (vector<unsigned_char,std::allocator<unsigned_char>> *)0x0) {
                          pvVar21 = pvVar12 + 1;
                          pvVar16 = pvVar12;
                          do {
                            pvVar15 = pvVar16;
                            pvVar13 = pvVar12;
                            pvVar6 = pvVar20;
                            pvVar7 = pvVar20;
                            if (pvVar15 <= pvVar11) break;
                            pvVar12 = pvVar13 + -1;
                            pvVar16 = pvVar15 + -1;
                          } while ((byte)pvVar15[-1] < 0x21);
                          do {
                            pvVar16 = pvVar7;
                            pvVar12 = pvVar6;
                            if (pvVar16 <= pvVar21) break;
                            pvVar6 = pvVar12 + -1;
                            pvVar7 = pvVar16 + -1;
                          } while ((byte)pvVar16[-1] < 0x21);
                          for (; (pvVar11 < pvVar15 && ((byte)*pvVar11 < 0x21));
                              pvVar11 = pvVar11 + 1) {
                          }
                          for (; (pvVar21 < pvVar16 && ((byte)*pvVar21 < 0x21));
                              pvVar21 = pvVar21 + 1) {
                          }
                          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_108,pvVar11,pvVar13);
                          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_e8,pvVar21,pvVar12);
                          p_Var5 = local_c8;
                          __pos = std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::_M_lower_bound((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_120,
                                                  (_Link_type)
                                                  (this->tags)._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent,local_c8,&local_108);
                          puVar10 = local_130;
                          if (((__pos._M_node == p_Var5) ||
                              (__n = __pos._M_node[1]._M_parent,
                              __n != (_Base_ptr)local_108._M_string_length)) ||
                             ((__n != (_Base_ptr)0x0 &&
                              (iVar8 = bcmp(*(void **)(__pos._M_node + 1),local_108._M_dataplus._M_p
                                            ,(size_t)__n), iVar8 != 0)))) {
                            std::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_c0,&local_108,&local_e8);
                            std::
                            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            ::
                            _M_emplace_hint_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                      (local_120,(const_iterator)__pos._M_node,
                                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_c0);
                            std::
                            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_c0);
                          }
                          else {
                            std::__cxx11::string::append((char *)(__pos._M_node + 2));
                            std::__cxx11::string::_M_append
                                      ((char *)(__pos._M_node + 2),(ulong)local_e8._M_dataplus._M_p)
                            ;
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                            operator_delete(local_e8._M_dataplus._M_p,
                                            local_e8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_108._M_dataplus._M_p != &local_108.field_2) {
                            operator_delete(local_108._M_dataplus._M_p,
                                            local_108.field_2._M_allocated_capacity + 1);
                          }
                        }
                        pvVar11 = pvVar20 + (1 - (long)puVar10);
                      } while (pvVar11 < local_128);
                    }
                    operator_delete__(puVar10);
                    goto LAB_00105b75;
                  }
                }
              }
            }
            operator_delete__(puVar10);
            (*this->_vptr_PSFFile[1])(this);
          }
        }
      }
    }
    fclose(__stream);
  }
  return (PSFFile *)0x0;
}

Assistant:

PSFFile * PSFFile::load(const std::string& filename)
{
	uint8_t data[4];

	off_t off_psf_size = path_getfilesize(filename.c_str());
	if (off_psf_size < 0)
	{
		return NULL;
	}
	size_t psf_size = (size_t) off_psf_size;

	FILE * fp = fopen(filename.c_str(), "rb");
	if (fp == NULL)
	{
		return NULL;
	}

	// signature
	uint8_t sig[PSF_SIGNATURE_SIZE];
	if (fread(sig, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return NULL;
	}
	if (memcmp(sig, PSF_SIGNATURE, PSF_SIGNATURE_SIZE) != 0)
	{
		fclose(fp);
		return NULL;
	}

	// version number
	if (fread(data, 1, 1, fp) != 1)
	{
		fclose(fp);
		return NULL;
	}
	uint8_t version = data[0];

	// size of reserved area
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t reserved_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// size of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// crc32 of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_crc_expected = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// check the size consistency beforehand
	if (0x10 + reserved_size + compressed_exe_size > psf_size)
	{
		fclose(fp);
		return NULL;
	}

	// create new PSF object
	PSFFile * psf = new PSFFile();
	psf->version = version;

	// reserved area
	uint8_t * reserved_data = new uint8_t[reserved_size];
	if (fread(reserved_data, 1, reserved_size, fp) != reserved_size)
	{
		delete [] reserved_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to vector
	for (size_t i = 0; i < reserved_size; i++)
	{
		psf->reserved.push_back(reserved_data[i]);
	}
	delete [] reserved_data;

	// compressed exe
	uint8_t * compressed_exe_data = new uint8_t[compressed_exe_size];
	if (fread(compressed_exe_data, 1, compressed_exe_size, fp) != compressed_exe_size)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// test crc32
	uint32_t compressed_exe_crc = ZlibReader::crc32(compressed_exe_data, compressed_exe_size);
	if (compressed_exe_crc != compressed_exe_crc_expected)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to ZlibReader
	psf->compressed_exe.assign(compressed_exe_data, compressed_exe_size);
	delete [] compressed_exe_data;

	// check tag marker (optional)
	uint8_t tag_marker[PSF_TAG_MARKER_SIZE];
	if (fread(tag_marker, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
	{
		// no tags
		fclose(fp);
		return psf;
	}
	if (memcmp(tag_marker, PSF_TAG_MARKER, PSF_TAG_MARKER_SIZE) != 0)
	{
		// no tags
		fclose(fp);
		return psf;
	}

	// read entire tag area
	size_t tag_size = psf_size - (0x10 + reserved_size + compressed_exe_size + PSF_TAG_MARKER_SIZE);
	char * tag_chrs = new char[tag_size + 1];
	if (fread(tag_chrs, 1, tag_size, fp) != tag_size)
	{
		// I/O error
		delete [] tag_chrs;
		delete psf;
		fclose(fp);
		return NULL;
	}
	tag_chrs[tag_size] = '\0';

	// Parse tag section. Details are available here:
	// http://wiki.neillcorlett.com/PSFTagFormat
	size_t off_curtag = 0;
	while (off_curtag < tag_size)
	{
		// Search the end position of the current line.
		char* ptr_newline = strchr(&tag_chrs[off_curtag], 0x0a);
		if (ptr_newline == NULL)
		{
			// Tag section must end with a newline.
			// Read the all remaining bytes if a newline lacks though.
			ptr_newline = tag_chrs + tag_size;
		}

		// Replace the newline with NUL,
		// for better C string function compatibility.
		*ptr_newline = '\0';

		// Search the variable=value separator.
		char* ptr_separator = strchr(&tag_chrs[off_curtag], '=');
		if (ptr_separator == NULL)
		{
			// Blank lines, or lines not of the form "variable=value", are ignored.
			off_curtag = ptr_newline + 1 - tag_chrs;
			continue;
		}

		// Determine the start/end position of variable.
		char* ptr_name = &tag_chrs[off_curtag];
		char* ptr_name_end = ptr_separator;
		char* ptr_value = ptr_separator + 1;
		char* ptr_value_end = ptr_newline;

		// Whitespace at the beginning/end of the line and before/after the = are ignored.
		// All characters 0x01-0x20 are considered whitespace.
		// (There must be no null (0x00) characters.)
		// Trim them.
		while (ptr_name_end > ptr_name && *(unsigned char*)(ptr_name_end - 1) <= 0x20)
			ptr_name_end--;
		while (ptr_value_end > ptr_value && *(unsigned char*)(ptr_value_end - 1) <= 0x20)
			ptr_value_end--;
		while (ptr_name < ptr_name_end && *(unsigned char*)ptr_name <= 0x20)
			ptr_name++;
		while (ptr_value < ptr_value_end && *(unsigned char*)ptr_value <= 0x20)
			ptr_value++;

		// Read variable=value as string.
		std::string tag_var_name(ptr_name, ptr_name_end - ptr_name);
		std::string tag_var_value(ptr_value, ptr_value_end - ptr_value);

		// Multiple-line variables must appear as consecutive lines using the same variable name.
		// For instance:
		//   comment=This is a
		//   comment=multiple-line
		//   comment=comment.
		// Therefore, check if the variable had already appeared.
		std::map<std::string, std::string>::iterator it = psf->tags.lower_bound(tag_var_name);
		if (it != psf->tags.end() && it->first == tag_var_name)
		{
			it->second += "\n";
			it->second += tag_var_value;
		}
		else
		{
			psf->tags.insert(it, make_pair(tag_var_name, tag_var_value));
		}

		off_curtag = ptr_newline + 1 - tag_chrs;
	}
	delete[] tag_chrs;
	fclose(fp);

	return psf;
}